

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O1

lzma_ret stream_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *filters,
                            lzma_check check)

{
  lzma_ret lVar1;
  undefined4 *coder_ptr;
  lzma_index *plVar2;
  lzma_stream_flags stream_flags;
  lzma_stream_flags local_68;
  
  if ((code *)next->init != stream_encoder_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)stream_encoder_init;
  if (filters == (lzma_filter *)0x0) {
    return LZMA_PROG_ERROR;
  }
  coder_ptr = (undefined4 *)next->coder;
  if (coder_ptr == (undefined4 *)0x0) {
    coder_ptr = (undefined4 *)lzma_alloc(0x5d0,allocator);
    if (coder_ptr == (undefined4 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = coder_ptr;
    next->code = stream_encode;
    next->end = stream_encoder_end;
    next->update = stream_encoder_update;
    *(undefined8 *)(coder_ptr + 0x48) = 0xffffffffffffffff;
    *(undefined8 *)(coder_ptr + 2) = 0;
    *(undefined8 *)(coder_ptr + 4) = 0xffffffffffffffff;
    *(undefined8 *)(coder_ptr + 6) = 0;
    *(undefined8 *)(coder_ptr + 8) = 0;
    *(undefined8 *)(coder_ptr + 10) = 0;
    *(undefined8 *)(coder_ptr + 0xc) = 0;
    *(undefined8 *)(coder_ptr + 0xe) = 0;
    *(undefined8 *)(coder_ptr + 0x10) = 0;
    *(undefined8 *)(coder_ptr + 0x12) = 0;
    *(undefined8 *)(coder_ptr + 0x5c) = 0;
    *(undefined8 *)(coder_ptr + 0x5e) = 0xffffffffffffffff;
    *(undefined8 *)(coder_ptr + 0x60) = 0;
    *(undefined8 *)(coder_ptr + 0x62) = 0;
    *(undefined8 *)(coder_ptr + 100) = 0;
    *(undefined8 *)(coder_ptr + 0x66) = 0;
    *(undefined8 *)(coder_ptr + 0x68) = 0;
    *(undefined8 *)(coder_ptr + 0x6a) = 0;
    *(undefined8 *)(coder_ptr + 0x6c) = 0;
    *(undefined8 *)(coder_ptr + 0x6e) = 0;
  }
  *coder_ptr = 0;
  coder_ptr[0x14] = 0;
  coder_ptr[0x16] = check;
  lzma_index_end(*(lzma_index **)(coder_ptr + 0x6e),allocator);
  plVar2 = lzma_index_init(allocator);
  *(lzma_index **)(coder_ptr + 0x6e) = plVar2;
  if (plVar2 == (lzma_index *)0x0) {
    return LZMA_MEM_ERROR;
  }
  local_68.reserved_enum2 = LZMA_RESERVED_ENUM;
  local_68.reserved_enum3 = LZMA_RESERVED_ENUM;
  local_68.reserved_enum4 = LZMA_RESERVED_ENUM;
  local_68.reserved_bool1 = '\0';
  local_68.reserved_bool2 = '\0';
  local_68.reserved_bool3 = '\0';
  local_68.reserved_bool4 = '\0';
  local_68.reserved_bool5 = '\0';
  local_68.reserved_bool6 = '\0';
  local_68.reserved_bool7 = '\0';
  local_68.reserved_bool8 = '\0';
  local_68.reserved_int1 = 0;
  local_68.version = 0;
  local_68._4_4_ = 0;
  local_68.backward_size = 0;
  local_68.reserved_int2 = 0;
  local_68._52_4_ = 0;
  local_68.reserved_enum1 = LZMA_RESERVED_ENUM;
  local_68.check = check;
  lVar1 = lzma_stream_header_encode(&local_68,(uint8_t *)(coder_ptr + 0x74));
  if (lVar1 == LZMA_OK) {
    *(undefined8 *)(coder_ptr + 0x70) = 0;
    *(undefined8 *)(coder_ptr + 0x72) = 0xc;
    lVar1 = stream_encoder_update(coder_ptr,allocator,filters,(lzma_filter *)0x0);
    return lVar1;
  }
  return lVar1;
}

Assistant:

static lzma_ret
stream_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter *filters, lzma_check check)
{
	lzma_next_coder_init(&stream_encoder_init, next, allocator);

	if (filters == NULL)
		return LZMA_PROG_ERROR;

	lzma_stream_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &stream_encode;
		next->end = &stream_encoder_end;
		next->update = &stream_encoder_update;

		coder->filters[0].id = LZMA_VLI_UNKNOWN;
		coder->block_encoder = LZMA_NEXT_CODER_INIT;
		coder->index_encoder = LZMA_NEXT_CODER_INIT;
		coder->index = NULL;
	}

	// Basic initializations
	coder->sequence = SEQ_STREAM_HEADER;
	coder->block_options.version = 0;
	coder->block_options.check = check;

	// Initialize the Index
	lzma_index_end(coder->index, allocator);
	coder->index = lzma_index_init(allocator);
	if (coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Encode the Stream Header
	lzma_stream_flags stream_flags = {
		.version = 0,
		.check = check,
	};
	return_if_error(lzma_stream_header_encode(
			&stream_flags, coder->buffer));

	coder->buffer_pos = 0;
	coder->buffer_size = LZMA_STREAM_HEADER_SIZE;

	// Initialize the Block encoder. This way we detect unsupported
	// filter chains when initializing the Stream encoder instead of
	// giving an error after Stream Header has already written out.
	return stream_encoder_update(coder, allocator, filters, NULL);
}